

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

eval_error *
chaiscript::boxed_cast<chaiscript::exception::eval_error_const&>
          (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  eval_error *peVar5;
  undefined8 *puVar6;
  undefined1 local_68 [8];
  _Rb_tree_impl<std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_true>
  _Stack_60;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68 = (undefined1  [8])&exception::eval_error::typeinfo;
    _Stack_60._0_8_ = &exception::eval_error::typeinfo;
    _Stack_60.super__Rb_tree_header._M_header._M_color = 3;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_68);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<chaiscript::exception::eval_error_const&>
                          ((t_conversions->m_conversions)._M_data), bVar4)) {
      if ((t_conversions != (Type_Conversions_State *)0x0) &&
         (bVar4 = Type_Conversions::convertable_type<chaiscript::exception::eval_error_const&>
                            ((t_conversions->m_conversions)._M_data), bVar4)) {
        _Stack_60.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&exception::eval_error::typeinfo;
        _Stack_60.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&exception::eval_error::typeinfo;
        _Stack_60.super__Rb_tree_header._M_header._M_right._0_4_ = 3;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_68,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)&_Stack_60.super__Rb_tree_header._M_header._M_parent,
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        peVar5 = (eval_error *)
                 detail::verify_type<void>
                           ((Boxed_Value *)local_68,(type_info *)&exception::eval_error::typeinfo,
                            *(void **)((long)local_68 + 0x28));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._0_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return peVar5;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._0_8_);
        return peVar5;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar1 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_60.super__Rb_tree_header._M_header._M_color = (peVar1->m_type_info).m_flags;
      _Stack_60.super__Rb_tree_header._M_header._4_4_ =
           *(undefined4 *)&(peVar1->m_type_info).field_0x14;
      peVar2 = (element_type *)(peVar1->m_type_info).m_type_info;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (peVar1->m_type_info).m_bare_type_info;
      *puVar6 = &PTR__bad_cast_003b4620;
      local_68._0_4_ = SUB84(peVar2,0);
      local_68._4_4_ = (undefined4)((ulong)peVar2 >> 0x20);
      _Stack_60._0_4_ = SUB84(p_Var3,0);
      _Stack_60._4_4_ = SUB84((ulong)p_Var3 >> 0x20,0);
      *(undefined4 *)(puVar6 + 1) = local_68._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_68._4_4_;
      *(undefined4 *)(puVar6 + 2) = _Stack_60._0_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = _Stack_60._4_4_;
      puVar6[3] = _Stack_60.super__Rb_tree_header._M_header._0_8_;
      puVar6[4] = &exception::eval_error::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_68 = (undefined1  [8])peVar2;
      _Stack_60._0_8_ = p_Var3;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  peVar5 = (eval_error *)
           detail::verify_type<void>
                     (bv,(type_info *)&exception::eval_error::typeinfo,
                      ((bv->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_const_data_ptr);
  return peVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }